

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O0

string * __thiscall
Diligent::
FormatString<char[38],char_const*,char[15],char[19],unsigned_int,char[31],unsigned_int,char[25],unsigned_int>
          (string *__return_storage_ptr__,Diligent *this,char (*Args) [38],char **Args_1,
          char (*Args_2) [15],char (*Args_3) [19],uint *Args_4,char (*Args_5) [31],uint *Args_6,
          char (*Args_7) [25],uint *Args_8)

{
  stringstream local_1d0 [8];
  stringstream ss;
  uint *Args_local_4;
  char (*Args_local_3) [19];
  char (*Args_local_2) [15];
  char **Args_local_1;
  char (*Args_local) [38];
  
  std::__cxx11::stringstream::stringstream(local_1d0);
  FormatStrSS<std::__cxx11::stringstream,char[38],char_const*,char[15],char[19],unsigned_int,char[31],unsigned_int,char[25],unsigned_int>
            ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d0,
             (char (*) [38])this,(char **)Args,(char (*) [15])Args_1,(char (*) [19])Args_2,
             (uint *)Args_3,(char (*) [31])Args_4,(uint *)Args_5,(char (*) [25])Args_6,
             (uint *)Args_7);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1d0);
  return __return_storage_ptr__;
}

Assistant:

std::string FormatString(const RestArgsType&... Args)
{
    std::stringstream ss;
    FormatStrSS(ss, Args...);
    return ss.str();
}